

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

Graph * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit(QualifiedIdentifierResolver *this,Graph *g)

{
  ModuleBase *pMVar1;
  Graph *pGVar2;
  
  pMVar1 = (this->currentModule).object;
  (this->currentModule).object = (ModuleBase *)g;
  pGVar2 = ModuleInstanceResolver::visitModule<soul::AST::Graph>
                     (&this->super_ModuleInstanceResolver,g);
  (this->currentModule).object = pMVar1;
  return pGVar2;
}

Assistant:

AST::Graph& visit (AST::Graph& g) override
        {
            auto lastModule = currentModule;
            currentModule = g;
            auto& result = ModuleInstanceResolver::visit (g);
            currentModule = lastModule;
            return result;
        }